

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanodet.cpp
# Opt level: O1

void generate_proposals(Mat *cls_pred,Mat *dis_pred,int stride,Mat *in_pad,float prob_threshold,
                       vector<Object,_std::allocator<Object>_> *objects)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  Layer *pLVar4;
  void *pvVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  undefined4 uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float pred_ltrb [4];
  Option opt;
  uint local_150;
  ulong local_148;
  void *local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 local_120;
  long *local_118;
  undefined4 local_110;
  uint uStack_10c;
  undefined8 uStack_108;
  undefined4 local_100;
  long local_f8;
  ParamDict local_e8;
  long local_d8;
  Mat *local_d0;
  Mat *local_c8;
  ulong local_c0;
  ulong local_b8;
  long local_b0;
  vector<Object,_std::allocator<Object>_> *local_a8;
  long local_a0;
  long local_98;
  ulong local_90;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined4 local_68;
  float local_64;
  bool local_51;
  
  if (in_pad->h < in_pad->w) {
    local_150 = in_pad->w / stride;
    uVar12 = cls_pred->h / (int)local_150;
  }
  else {
    uVar12 = in_pad->h / stride;
    local_150 = cls_pred->h / (int)uVar12;
  }
  iVar1 = dis_pred->w;
  iVar6 = iVar1 + 3;
  if (-1 < iVar1) {
    iVar6 = iVar1;
  }
  if (0 < (int)uVar12) {
    uVar2 = cls_pred->w;
    uVar7 = iVar6 >> 2;
    local_b0 = (long)(int)uVar7 * 4;
    fVar17 = (float)stride;
    uVar13 = (ulong)local_150;
    local_c0 = (ulong)uVar12;
    local_d8 = 0;
    local_148 = 0;
    local_d0 = dis_pred;
    local_c8 = cls_pred;
    local_b8 = uVar13;
    local_a8 = objects;
    do {
      if (0 < (int)local_150) {
        local_a0 = local_148 * uVar13;
        local_88 = ZEXT416((uint)(((float)(int)local_148 + 0.5) * fVar17));
        uVar14 = 0;
        local_98 = local_d8;
        do {
          if ((int)uVar2 < 1) {
            uVar10 = 0xffffffff;
            fVar15 = -3.4028235e+38;
          }
          else {
            uVar11 = 0xffffffff;
            uVar8 = 0;
            fVar15 = -3.4028235e+38;
            do {
              fVar16 = *(float *)((long)local_c8->data +
                                 uVar8 * 4 + local_c8->elemsize * local_98 * (long)local_c8->w);
              if (fVar15 < fVar16) {
                uVar11 = uVar8 & 0xffffffff;
              }
              uVar10 = (undefined4)uVar11;
              if (fVar16 <= fVar15) {
                fVar16 = fVar15;
              }
              fVar15 = fVar16;
              uVar8 = uVar8 + 1;
            } while (uVar2 != uVar8);
          }
          if (0.4 <= fVar15) {
            local_138 = (void *)((long)local_d0->w * (local_a0 + uVar14) * local_d0->elemsize +
                                (long)local_d0->data);
            uStack_130 = 0;
            uStack_12c = 0;
            local_128 = 4;
            uStack_124 = 0;
            local_120 = 1;
            local_118 = (long *)0x0;
            local_110 = 2;
            uStack_108 = 0x100000004;
            local_100 = 1;
            local_f8 = local_b0;
            local_90 = uVar14;
            uStack_10c = uVar7;
            pLVar4 = ncnn::create_layer("Softmax");
            ncnn::ParamDict::ParamDict(&local_e8);
            ncnn::ParamDict::set(&local_e8,0,1);
            ncnn::ParamDict::set(&local_e8,1,1);
            (*pLVar4->_vptr_Layer[2])(pLVar4,&local_e8);
            ncnn::Option::Option((Option *)&local_78);
            fStack_74 = 1.4013e-45;
            local_51 = false;
            (*pLVar4->_vptr_Layer[4])(pLVar4,(Option *)&local_78);
            (*pLVar4->_vptr_Layer[9])(pLVar4,&local_138,(Option *)&local_78);
            (*pLVar4->_vptr_Layer[5])(pLVar4);
            (*pLVar4->_vptr_Layer[1])(pLVar4);
            ncnn::ParamDict::~ParamDict(&local_e8);
            uVar14 = local_90;
            lVar9 = 0;
            pvVar5 = local_138;
            do {
              fVar16 = 0.0;
              if (3 < iVar1) {
                uVar13 = 0;
                do {
                  fVar16 = fVar16 + (float)(int)uVar13 * *(float *)((long)pvVar5 + uVar13 * 4);
                  uVar13 = uVar13 + 1;
                } while (uVar7 != uVar13);
              }
              *(float *)((long)&local_e8._vptr_ParamDict + lVar9 * 4) = fVar16 * fVar17;
              lVar9 = lVar9 + 1;
              pvVar5 = (void *)((long)pvVar5 +
                               (long)(int)uStack_10c * CONCAT44(uStack_124,local_128));
            } while (lVar9 != 4);
            fVar16 = ((float)(int)local_90 + 0.5) * fVar17;
            local_78 = fVar16 - SUB84(local_e8._vptr_ParamDict,0);
            fStack_74 = (float)local_88._0_4_ - (float)((ulong)local_e8._vptr_ParamDict >> 0x20);
            fStack_70 = (SUB84(local_e8.d,0) + fVar16) - local_78;
            fStack_6c = ((float)((ulong)local_e8.d >> 0x20) + (float)local_88._0_4_) - fStack_74;
            local_68 = uVar10;
            local_64 = fVar15;
            std::vector<Object,_std::allocator<Object>_>::push_back
                      (local_a8,(value_type *)&local_78);
            piVar3 = (int *)CONCAT44(uStack_12c,uStack_130);
            uVar13 = local_b8;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (local_118 == (long *)0x0) {
                  if (local_138 != (void *)0x0) {
                    free(local_138);
                    uVar13 = local_b8;
                  }
                }
                else {
                  (**(code **)(*local_118 + 0x18))();
                  uVar13 = local_b8;
                }
              }
            }
          }
          uVar14 = uVar14 + 1;
          local_98 = local_98 + 1;
        } while (uVar14 != uVar13);
      }
      local_148 = local_148 + 1;
      local_d8 = local_d8 + uVar13;
    } while (local_148 != local_c0);
  }
  return;
}

Assistant:

static void generate_proposals(const ncnn::Mat& cls_pred, const ncnn::Mat& dis_pred, int stride, const ncnn::Mat& in_pad, float prob_threshold, std::vector<Object>& objects)
{
    const int num_grid = cls_pred.h;

    int num_grid_x;
    int num_grid_y;
    if (in_pad.w > in_pad.h)
    {
        num_grid_x = in_pad.w / stride;
        num_grid_y = num_grid / num_grid_x;
    }
    else
    {
        num_grid_y = in_pad.h / stride;
        num_grid_x = num_grid / num_grid_y;
    }

    const int num_class = cls_pred.w;
    const int reg_max_1 = dis_pred.w / 4;

    for (int i = 0; i < num_grid_y; i++)
    {
        for (int j = 0; j < num_grid_x; j++)
        {
            const int idx = i * num_grid_x + j;

            const float* scores = cls_pred.row(idx);

            // find label with max score
            int label = -1;
            float score = -FLT_MAX;
            for (int k = 0; k < num_class; k++)
            {
                if (scores[k] > score)
                {
                    label = k;
                    score = scores[k];
                }
            }

            if (score >= prob_threshold)
            {
                ncnn::Mat bbox_pred(reg_max_1, 4, (void*)dis_pred.row(idx));
                {
                    ncnn::Layer* softmax = ncnn::create_layer("Softmax");

                    ncnn::ParamDict pd;
                    pd.set(0, 1); // axis
                    pd.set(1, 1);
                    softmax->load_param(pd);

                    ncnn::Option opt;
                    opt.num_threads = 1;
                    opt.use_packing_layout = false;

                    softmax->create_pipeline(opt);

                    softmax->forward_inplace(bbox_pred, opt);

                    softmax->destroy_pipeline(opt);

                    delete softmax;
                }

                float pred_ltrb[4];
                for (int k = 0; k < 4; k++)
                {
                    float dis = 0.f;
                    const float* dis_after_sm = bbox_pred.row(k);
                    for (int l = 0; l < reg_max_1; l++)
                    {
                        dis += l * dis_after_sm[l];
                    }

                    pred_ltrb[k] = dis * stride;
                }

                float pb_cx = (j + 0.5f) * stride;
                float pb_cy = (i + 0.5f) * stride;

                float x0 = pb_cx - pred_ltrb[0];
                float y0 = pb_cy - pred_ltrb[1];
                float x1 = pb_cx + pred_ltrb[2];
                float y1 = pb_cy + pred_ltrb[3];

                Object obj;
                obj.rect.x = x0;
                obj.rect.y = y0;
                obj.rect.width = x1 - x0;
                obj.rect.height = y1 - y0;
                obj.label = label;
                obj.prob = score;

                objects.push_back(obj);
            }
        }
    }
}